

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helpers.cpp
# Opt level: O2

string * duckdb::TestDirectoryPath_abi_cxx11_(void)

{
  char cVar1;
  __pid_t __val;
  pointer pFVar2;
  string *in_RDI;
  string test_directory;
  _Head_base<0UL,_duckdb::FileSystem_*,_false> local_80;
  string local_78 [32];
  string local_58;
  string local_38 [32];
  
  duckdb::FileSystem::CreateLocal();
  GetTestDirectory_abi_cxx11_();
  pFVar2 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::operator->
                     ((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                       *)&local_80);
  cVar1 = (**(code **)(*(long *)pFVar2 + 0x68))(pFVar2,local_78,0);
  if (cVar1 == '\0') {
    pFVar2 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
             operator->((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                         *)&local_80);
    (**(code **)(*(long *)pFVar2 + 0x70))(pFVar2,local_78,0);
  }
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  if (custom_test_directory_abi_cxx11_._8_8_ == 0) {
    __val = getpid();
    pFVar2 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
             operator->((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                         *)&local_80);
    Catch::clara::std::__cxx11::to_string(&local_58,__val);
    duckdb::FileSystem::JoinPath(local_38,(string *)pFVar2);
    std::__cxx11::string::operator=((string *)in_RDI,local_38);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    std::__cxx11::string::_M_assign((string *)in_RDI);
  }
  pFVar2 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::operator->
                     ((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                       *)&local_80);
  cVar1 = (**(code **)(*(long *)pFVar2 + 0x68))(pFVar2);
  if (cVar1 == '\0') {
    pFVar2 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
             operator->((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                         *)&local_80);
    (**(code **)(*(long *)pFVar2 + 0x70))(pFVar2);
  }
  std::__cxx11::string::~string(local_78);
  if (local_80._M_head_impl != (FileSystem *)0x0) {
    (**(code **)(*(long *)local_80._M_head_impl + 8))();
  }
  return in_RDI;
}

Assistant:

string TestDirectoryPath() {
	duckdb::unique_ptr<FileSystem> fs = FileSystem::CreateLocal();
	auto test_directory = GetTestDirectory();
	if (!fs->DirectoryExists(test_directory)) {
		fs->CreateDirectory(test_directory);
	}
	string path;
	if (custom_test_directory.empty()) {
		// add the PID to the test directory - but only if it was not specified explicitly by the user
		auto pid = getpid();
		path = fs->JoinPath(test_directory, to_string(pid));
	} else {
		path = test_directory;
	}
	if (!fs->DirectoryExists(path)) {
		fs->CreateDirectory(path);
	}
	return path;
}